

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O2

cstr __thiscall
idx2::ToString<idx2::idx2_err_code>(idx2 *this,error<idx2::idx2_err_code> *Err,bool Force)

{
  cstr __s;
  long *in_FS_OFFSET;
  stref sVar1;
  
  if (((int)Err == 0) && (this[10] == (idx2)0x1)) {
    __s = (cstr)(*in_FS_OFFSET + -0xc80);
  }
  else {
    sVar1 = ToString((idx2_err_code)this[8]);
    __s = (cstr)(*in_FS_OFFSET + -0xc80);
    snprintf(__s,0x400,"%.*s (file: %s, line %d): %s",sVar1._8_8_ & 0xffffffff,sVar1.field_0.Ptr,
             in_FS_OFFSET[-0x1d0],(ulong)*(uint *)(in_FS_OFFSET + -0x1f0),*(undefined8 *)this);
  }
  return __s;
}

Assistant:

cstr
ToString(const error<t>& Err, bool Force)
{
  if (Force || !Err.StrGened)
  {
    auto ErrStr = ToString(Err.Code);
    snprintf(ScratchBuf,
             sizeof(ScratchBuf),
             "%.*s (file: %s, line %d): %s",
             ErrStr.Size,
             ErrStr.Ptr,
             Err.Files[0],
             Err.Lines[0],
             Err.Msg);
  }
  return ScratchBuf;
}